

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O1

void add_rect(nhrect *r)

{
  int iVar1;
  nhrect *pnVar2;
  long lVar3;
  
  iVar1 = rect_cnt;
  lVar3 = (long)rect_cnt;
  if (lVar3 < 0x32) {
    pnVar2 = get_rect(r);
    if (pnVar2 == (nhrect *)0x0) {
      rect[lVar3] = *r;
      rect_cnt = iVar1 + 1;
    }
  }
  else if (flags.debug != '\0') {
    pline("MAXRECT may be too small.");
    return;
  }
  return;
}

Assistant:

void add_rect(struct nhrect *r)
{
	if (rect_cnt >= MAXRECT) {
		if (wizard) pline("MAXRECT may be too small.");
		return;
	}
	/* Check that this struct nhrect is not included in another one */
	if (get_rect(r))
	    return;
	rect[rect_cnt] = *r;
	rect_cnt++;
}